

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int UTF16BEToUTF8(uchar *out,int *outlen,uchar *inb,int *inlenb)

{
  int iVar1;
  sbyte sVar2;
  uint uVar3;
  uint uVar4;
  uchar *processed;
  int iVar5;
  byte *pbVar6;
  uint uVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte bVar10;
  
  iVar5 = (int)out;
  iVar1 = *outlen;
  uVar3 = *inlenb;
  if ((uVar3 & 0x80000001) == 1) {
    uVar3 = uVar3 - 1;
    *inlenb = uVar3;
  }
  pbVar9 = inb;
  if (2 < uVar3 + 1) {
    pbVar6 = out + iVar1;
    do {
      uVar7 = (uint)CONCAT11(*pbVar9,pbVar9[1]);
      pbVar8 = pbVar9 + 2;
      if ((*pbVar9 & 0xfc) == 0xd8) {
        if ((inb + (ulong)(uint)((int)uVar3 / 2) * 2 <= pbVar8) ||
           (bVar10 = *pbVar8, (bVar10 & 0xfffffffc) != 0xdc)) {
          *outlen = (int)out - iVar5;
          *inlenb = (int)pbVar9 - (int)inb;
          return -2;
        }
        pbVar8 = pbVar9 + 4;
        uVar7 = (uVar7 & 0x3ff) * 0x400 + ((bVar10 & 3) << 8 | (uint)pbVar9[3]) + 0x10000;
      }
      if (pbVar6 <= out) break;
      if (uVar7 < 0x80) {
        *out = (byte)uVar7;
        out = out + 1;
      }
      else {
        sVar2 = 0x12;
        if (0xffff >= uVar7) {
          sVar2 = 0xc;
        }
        bVar10 = (0xffff < uVar7) << 4 | 0xe0;
        if (uVar7 < 0x800) {
          bVar10 = 0xc0;
        }
        if (uVar7 < 0x800) {
          sVar2 = 6;
        }
        *out = (byte)(uVar7 >> sVar2) | bVar10;
        out = out + 1;
        if (out < pbVar6) {
          uVar4 = 0xc;
          if (uVar7 < 0x10000) {
            uVar4 = 6;
          }
          if (uVar7 < 0x800) {
            uVar4 = 0;
          }
          do {
            *out = (byte)(uVar7 >> ((byte)uVar4 & 0x1f)) & 0x3f | 0x80;
            out = out + 1;
            if (uVar4 < 6) break;
            uVar4 = uVar4 - 6;
          } while (out < pbVar6);
        }
      }
      pbVar9 = pbVar8;
    } while (pbVar8 < inb + (ulong)(uint)((int)uVar3 / 2) * 2);
  }
  *outlen = (int)out - iVar5;
  *inlenb = (int)pbVar9 - (int)inb;
  return *outlen;
}

Assistant:

static int
UTF16BEToUTF8(unsigned char* out, int *outlen,
            const unsigned char* inb, int *inlenb)
{
    unsigned char* outstart = out;
    const unsigned char* processed = inb;
    unsigned char* outend = out + *outlen;
    unsigned short* in = (unsigned short*) inb;
    unsigned short* inend;
    unsigned int c, d, inlen;
    unsigned char *tmp;
    int bits;

    if ((*inlenb % 2) == 1)
        (*inlenb)--;
    inlen = *inlenb / 2;
    inend= in + inlen;
    while (in < inend) {
	if (xmlLittleEndian) {
	    tmp = (unsigned char *) in;
	    c = *tmp++;
	    c = c << 8;
	    c = c | (unsigned int) *tmp;
	    in++;
	} else {
	    c= *in++;
	}
        if ((c & 0xFC00) == 0xD800) {    /* surrogates */
	    if (in >= inend) {           /* (in > inend) shouldn't happens */
		*outlen = out - outstart;
		*inlenb = processed - inb;
	        return(-2);
	    }
	    if (xmlLittleEndian) {
		tmp = (unsigned char *) in;
		d = *tmp++;
		d = d << 8;
		d = d | (unsigned int) *tmp;
		in++;
	    } else {
		d= *in++;
	    }
            if ((d & 0xFC00) == 0xDC00) {
                c &= 0x03FF;
                c <<= 10;
                c |= d & 0x03FF;
                c += 0x10000;
            }
            else {
		*outlen = out - outstart;
		*inlenb = processed - inb;
	        return(-2);
	    }
        }

	/* assertion: c is a single UTF-4 value */
        if (out >= outend)
	    break;
        if      (c <    0x80) {  *out++=  c;                bits= -6; }
        else if (c <   0x800) {  *out++= ((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
        else if (c < 0x10000) {  *out++= ((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
        else                  {  *out++= ((c >> 18) & 0x07) | 0xF0;  bits= 12; }

        for ( ; bits >= 0; bits-= 6) {
            if (out >= outend)
	        break;
            *out++= ((c >> bits) & 0x3F) | 0x80;
        }
	processed = (const unsigned char*) in;
    }
    *outlen = out - outstart;
    *inlenb = processed - inb;
    return(*outlen);
}